

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void wasm_val_vec_delete(wasm_val_vec_t *vec)

{
  wasm_val_t *pwVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  lVar2 = 0;
  fprintf(_stderr,"CAPI: [%s] \n","wasm_val_vec_delete");
  for (uVar3 = 0; pwVar1 = vec->data, uVar3 < vec->size; uVar3 = uVar3 + 1) {
    wasm_val_delete((wasm_val_t *)(&pwVar1->kind + lVar2));
    lVar2 = lVar2 + 0x10;
  }
  if (pwVar1 != (wasm_val_t *)0x0) {
    operator_delete__(pwVar1);
  }
  vec->size = 0;
  return;
}

Assistant:

void wasm_val_vec_delete(own wasm_val_vec_t* vec) {
  TRACE0();
  for (size_t i = 0; i < vec->size; ++i) {
    wasm_val_delete(&vec->data[i]);
  }
  delete[] vec->data;
  vec->size = 0;
}